

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::TestCase::failed_test_count(TestCase *this)

{
  bool bVar1;
  pointer ppTVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  
  ppTVar5 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar5 == ppTVar2) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      uVar3 = 0;
      if ((*ppTVar5)->should_run_ == true) {
        bVar1 = TestResult::Failed(&(*ppTVar5)->result_);
        uVar3 = (uint)bVar1;
        ppTVar2 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      iVar4 = iVar4 + uVar3;
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 != ppTVar2);
  }
  return iVar4;
}

Assistant:

int TestCase::failed_test_count() const {
  return CountIf(test_info_list_, TestFailed);
}